

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::analysis::ForwardPointer::IsSameImpl
          (ForwardPointer *this,Type *that,IsSameCache *param_2)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x30])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    if ((this->pointer_ == (Pointer *)0x0) || (*(Type **)(lVar3 + 0x30) == (Type *)0x0)) {
      if (*(int *)&(this->super_Type).field_0x24 != *(int *)(lVar3 + 0x24)) {
        return false;
      }
    }
    else {
      bVar1 = analysis::Type::operator==(&this->pointer_->super_Type,*(Type **)(lVar3 + 0x30));
      if (!bVar1) {
        return false;
      }
    }
    if (this->storage_class_ == *(StorageClass *)(lVar3 + 0x28)) {
      bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool ForwardPointer::IsSameImpl(const Type* that, IsSameCache*) const {
  const ForwardPointer* fpt = that->AsForwardPointer();
  if (!fpt) return false;
  return (pointer_ && fpt->pointer_ ? *pointer_ == *fpt->pointer_
                                    : target_id_ == fpt->target_id_) &&
         storage_class_ == fpt->storage_class_ && HasSameDecorations(that);
}